

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

bool __thiscall USDFParser::ParsePage(USDFParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FTextureID FVar4;
  FStrifeDialogueNode *this_00;
  PClassActor *pPVar5;
  char *pcVar6;
  FSoundID local_70;
  FSoundID local_6c;
  FString local_68;
  FString soundname;
  char *name;
  undefined1 local_50 [8];
  FName key;
  bool block;
  FString Dialogue;
  FString SpeakerName;
  FStrifeDialogueReply **replyptr;
  FString local_20;
  FStrifeDialogueNode *node;
  USDFParser *this_local;
  
  node = (FStrifeDialogueNode *)this;
  this_00 = (FStrifeDialogueNode *)operator_new(0x48);
  FStrifeDialogueNode::FStrifeDialogueNode(this_00);
  SpeakerName.Chars = (char *)&this_00->Children;
  this_00->SpeakerVoice = 0;
  this_00->Backdrop = 0;
  this_00->Dialogue = (char *)0x0;
  this_00->SpeakerType = (PClassActor *)0x0;
  this_00->SpeakerName = (char *)0x0;
  (this_00->ItemCheck).Most = 0;
  (this_00->ItemCheck).Count = 0;
  this_00->ThisNodeNum = 0;
  this_00->ItemCheckNode = 0;
  this_00->DropType = (PClassActor *)0x0;
  (this_00->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
  this_00->Children = (FStrifeDialogueReply *)0x0;
  local_20.Chars = (char *)this_00;
  uVar2 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Push
                    (&StrifeDialogues,(FStrifeDialogueNode **)&local_20);
  *(uint *)(local_20.Chars + 0x18) = uVar2;
  *(int *)(local_20.Chars + 0x1c) = -1;
  FString::FString(&Dialogue);
  FString::FString((FString *)&key);
LAB_006e7cce:
  do {
    while( true ) {
      while( true ) {
        bVar1 = FScanner::CheckToken((FScanner *)this,0x7d);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          pcVar6 = FString::operator_cast_to_char_(&Dialogue);
          pcVar6 = ncopystring(pcVar6);
          *(char **)(local_20.Chars + 0x28) = pcVar6;
          pcVar6 = FString::operator_cast_to_char_((FString *)&key);
          pcVar6 = ncopystring(pcVar6);
          *(char **)(local_20.Chars + 0x38) = pcVar6;
          this_local._7_1_ = 1;
          goto LAB_006e814a;
        }
        local_50[7] = 0;
        UDMFParserBase::ParseKey((UDMFParserBase *)local_50,SUB81(this,0),(bool *)0x1);
        if ((local_50[7] & 1) != 0) break;
        iVar3 = FName::operator_cast_to_int((FName *)local_50);
        if (iVar3 == 0x28) {
          pcVar6 = FName::operator_cast_to_char_((FName *)local_50);
          soundname.Chars = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          if (*soundname.Chars != '\0') {
            FString::FString(&local_68,"svox/");
            FString::operator+=(&local_68,soundname.Chars);
            pcVar6 = FString::operator_cast_to_char_(&local_68);
            iVar3 = S_FindSound(pcVar6);
            FSoundID::FSoundID(&local_6c,iVar3);
            FSoundID::operator=((FSoundID *)(local_20.Chars + 0x30),&local_6c);
            iVar3 = FSoundID::operator_cast_to_int((FSoundID *)(local_20.Chars + 0x30));
            if ((iVar3 == 0) && ((this->super_UDMFParserBase).namespace_bits == 1)) {
              iVar3 = S_FindSound(soundname.Chars);
              FSoundID::FSoundID(&local_70,iVar3);
              FSoundID::operator=((FSoundID *)(local_20.Chars + 0x30),&local_70);
            }
            FString::~FString(&local_68);
          }
        }
        else if (iVar3 == 0xaf) {
          pcVar6 = FName::operator_cast_to_char_((FName *)local_50);
          pPVar5 = CheckActorType(this,pcVar6);
          *(PClassActor **)local_20.Chars = pPVar5;
        }
        else if (iVar3 == 0x1cf) {
          pcVar6 = FName::operator_cast_to_char_((FName *)local_50);
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FString::operator=(&Dialogue,pcVar6);
        }
        else if (iVar3 == 0x1d0) {
          pcVar6 = FName::operator_cast_to_char_((FName *)local_50);
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FVar4 = FTextureManager::CheckForTexture(&TexMan,pcVar6,8,1);
          ((FTextureID *)(local_20.Chars + 0x34))->texnum = FVar4.texnum;
        }
        else if (iVar3 == 0x1d1) {
          pcVar6 = FName::operator_cast_to_char_((FName *)local_50);
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FString::operator=((FString *)&key,pcVar6);
        }
        else if (iVar3 == 0x1d4) {
          pcVar6 = FName::operator_cast_to_char_((FName *)local_50);
          iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          *(int *)(local_20.Chars + 0x1c) = iVar3;
        }
      }
      iVar3 = FName::operator_cast_to_int((FName *)local_50);
      if (iVar3 != 0x1d2) break;
      bVar1 = ParseIfItem(this,(FStrifeDialogueNode *)local_20.Chars);
      if (!bVar1) {
        this_local._7_1_ = 0;
LAB_006e814a:
        FString::~FString((FString *)&key);
        FString::~FString(&Dialogue);
        return (bool)(this_local._7_1_ & 1);
      }
    }
    if (iVar3 != 0x1d3) {
      FScanner::UnGet((FScanner *)this);
      UDMFParserBase::Skip(&this->super_UDMFParserBase);
      goto LAB_006e7cce;
    }
    bVar1 = ParseChoice(this,(FStrifeDialogueReply ***)&SpeakerName);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_006e814a;
    }
  } while( true );
}

Assistant:

bool ParsePage()
	{
		FStrifeDialogueNode *node = new FStrifeDialogueNode;
		FStrifeDialogueReply **replyptr = &node->Children;
		memset(node, 0, sizeof(*node));
		//node->ItemCheckCount[0] = node->ItemCheckCount[1] = node->ItemCheckCount[2] = -1;

		node->ThisNodeNum = StrifeDialogues.Push(node);
		node->ItemCheckNode = -1;

		FString SpeakerName;
		FString Dialogue;

		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Name:
					SpeakerName = CheckString(key);
					break;

				case NAME_Panel:
					node->Backdrop = TexMan.CheckForTexture (CheckString(key), FTexture::TEX_MiscPatch);
					break;

				case NAME_Voice:
					{
						const char * name = CheckString(key);
						if (name[0] != 0)
						{
							FString soundname = "svox/";
							soundname += name;
							node->SpeakerVoice = FSoundID(S_FindSound(soundname));
							if (node->SpeakerVoice == 0 && namespace_bits == Zd)
							{
								node->SpeakerVoice = FSoundID(S_FindSound(name));
							}
						}
					}
					break;

				case NAME_Dialog:
					Dialogue = CheckString(key);
					break;

				case NAME_Drop:
					node->DropType = CheckActorType(key);
					break;

				case NAME_Link:
					node->ItemCheckNode = CheckInt(key);
					break;


				}
			}
			else
			{
				switch(key)
				{
				case NAME_Ifitem:
					if (!ParseIfItem(node)) return false;
					break;

				case NAME_Choice:
					if (!ParseChoice(replyptr)) return false;
					break;

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		node->SpeakerName = ncopystring(SpeakerName);
		node->Dialogue = ncopystring(Dialogue);
		return true;
	}